

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_digital_filter.cc
# Opt level: O0

bool __thiscall
sptk::AllPoleDigitalFilter::Run
          (AllPoleDigitalFilter *this,vector<double,_std::allocator<double>_> *filter_coefficients,
          double filter_input,double *filter_output,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  long in_RCX;
  double *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double in_XMM0_Qa;
  int m_1;
  int m;
  double sum;
  double *d;
  double *a;
  double gained_input;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  size_type in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  
  if (((((*(byte *)((long)in_RDI._M_current + 0xd) & 1) == 0) ||
       (sVar1 = ::std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar1 != (long)(*(int *)(in_RDI._M_current + 1) + 1))) || (in_RDX == (double *)0x0)) ||
     (in_RCX == 0)) {
    return false;
  }
  sVar1 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
  if (sVar1 != (long)*(int *)(in_RDI._M_current + 1)) {
    ::std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    __first._M_current._4_4_ = in_stack_ffffffffffffff94;
    __first._M_current._0_4_ = in_stack_ffffffffffffff90;
    ::std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first,in_RDI,in_stack_ffffffffffffff80);
  }
  pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  in_XMM0_Qa = in_XMM0_Qa * *pvVar2;
  if (*(int *)(in_RDI._M_current + 1) == 0) {
    *in_RDX = in_XMM0_Qa;
    return true;
  }
  pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
  pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),0);
  if ((*(byte *)((long)in_RDI._M_current + 0xc) & 1) == 0) {
    iVar5 = *(int *)(in_RDI._M_current + 1);
    while (iVar4 = iVar5 + -1, 0 < iVar4) {
      in_XMM0_Qa = -pvVar2[iVar4] * pvVar3[iVar4] + in_XMM0_Qa;
      pvVar3[iVar4] = pvVar3[iVar5 + -2];
      iVar5 = iVar4;
    }
    in_XMM0_Qa = -*pvVar2 * *pvVar3 + in_XMM0_Qa;
    *pvVar3 = in_XMM0_Qa;
  }
  else {
    in_XMM0_Qa = in_XMM0_Qa - *pvVar3;
    for (iVar5 = 1; iVar5 < *(int *)(in_RDI._M_current + 1); iVar5 = iVar5 + 1) {
      pvVar3[iVar5 + -1] = pvVar2[iVar5 + -1] * in_XMM0_Qa + pvVar3[iVar5];
    }
    pvVar3[*(int *)(in_RDI._M_current + 1) + -1] =
         pvVar2[*(int *)(in_RDI._M_current + 1) + -1] * in_XMM0_Qa;
  }
  *in_RDX = in_XMM0_Qa;
  return true;
}

Assistant:

bool AllPoleDigitalFilter::Run(const std::vector<double>& filter_coefficients,
                               double filter_input, double* filter_output,
                               AllPoleDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* a(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(gained_input);

  // Apply all-pole filter.
  if (transposition_) {
    sum -= d[0];
    for (int m(1); m < num_filter_order_; ++m) {
      d[m - 1] = d[m] + a[m - 1] * sum;
    }
    d[num_filter_order_ - 1] = a[num_filter_order_ - 1] * sum;
  } else {
    for (int m(num_filter_order_ - 1); 0 < m; --m) {
      sum -= a[m] * d[m];
      d[m] = d[m - 1];
    }
    sum -= a[0] * d[0];
    d[0] = sum;
  }

  // Save result.
  *filter_output = sum;

  return true;
}